

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

MemFile * memdbFromDbSchema(sqlite3 *db,char *zSchema)

{
  MemStore *pMVar1;
  int iVar2;
  MemFile *p;
  MemFile *local_10;
  
  local_10 = (MemFile *)0x0;
  iVar2 = sqlite3_file_control(db,zSchema,7,&local_10);
  if ((iVar2 == 0) && ((local_10->base).pMethods == &memdb_io_methods)) {
    pMVar1 = local_10->pStore;
    if (pMVar1->pMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(pMVar1->pMutex);
    }
    if (pMVar1->zFName != (char *)0x0) {
      local_10 = (MemFile *)0x0;
    }
    if (pMVar1->pMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(pMVar1->pMutex);
    }
  }
  else {
    local_10 = (MemFile *)0x0;
  }
  return local_10;
}

Assistant:

static MemFile *memdbFromDbSchema(sqlite3 *db, const char *zSchema){
  MemFile *p = 0;
  MemStore *pStore;
  int rc = sqlite3_file_control(db, zSchema, SQLITE_FCNTL_FILE_POINTER, &p);
  if( rc ) return 0;
  if( p->base.pMethods!=&memdb_io_methods ) return 0;
  pStore = p->pStore;
  memdbEnter(pStore);
  if( pStore->zFName!=0 ) p = 0;
  memdbLeave(pStore);
  return p;
}